

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_base_assert_ok_nolock_(event_base *base)

{
  event **ppeVar1;
  long lVar2;
  long lVar3;
  evcallback_list *peVar4;
  long lVar5;
  int iVar6;
  common_timeout_list *pcVar7;
  undefined8 uVar8;
  common_timeout_list *pcVar9;
  event *peVar10;
  ulong uVar11;
  event_callback *peVar12;
  event *peVar13;
  char *pcVar14;
  event_callback *peVar15;
  event_callback *peVar16;
  event_callback *peVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  
  evmap_check_integrity_(base);
  uVar11 = 0;
  do {
    uVar18 = uVar11 + 1;
    if ((long)(int)(base->timeheap).n <= (long)uVar18) {
      uVar18 = 0;
      uVar11 = (ulong)(uint)base->n_common_timeouts;
      if (base->n_common_timeouts < 1) {
        uVar11 = uVar18;
      }
      goto LAB_00266be5;
    }
    ppeVar1 = (base->timeheap).p;
    peVar10 = ppeVar1[uVar11 + 1];
    if (((peVar10->ev_evcallback).evcb_flags & 1) == 0) {
      pcVar14 = "ev->ev_flags & EVLIST_TIMEOUT";
      uVar8 = 0xf8d;
      goto LAB_00266f34;
    }
    peVar13 = ppeVar1[uVar11 >> 1 & 0x7fffffff];
    lVar2 = (peVar10->ev_timeout).tv_sec;
    lVar3 = (peVar13->ev_timeout).tv_sec;
    bVar20 = SBORROW8(lVar3,lVar2);
    lVar5 = lVar3 - lVar2;
    bVar19 = lVar3 == lVar2;
    if (bVar19) {
      lVar2 = (peVar13->ev_timeout).tv_usec;
      lVar3 = (peVar10->ev_timeout).tv_usec;
      bVar20 = SBORROW8(lVar2,lVar3);
      lVar5 = lVar2 - lVar3;
      bVar19 = lVar2 == lVar3;
    }
    if (!bVar19 && bVar20 == lVar5 < 0) {
      pcVar14 = "evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=)";
      uVar8 = 0xf8e;
      goto LAB_00266f34;
    }
    uVar11 = uVar18;
  } while (uVar18 == (uint)(peVar10->ev_timeout_pos).min_heap_idx);
  pcVar14 = "ev->ev_timeout_pos.min_heap_idx == i";
  uVar8 = 0xf8f;
  goto LAB_00266f34;
LAB_00266be5:
  if (uVar18 != uVar11) {
    pcVar7 = base->common_timeout_queues[uVar18];
    peVar10 = (pcVar7->events).tqh_first;
    peVar13 = peVar10;
    if (peVar10 != (event *)0x0) {
LAB_00266c04:
      pcVar9 = pcVar7;
      if ((peVar10 != (event *)0x0) &&
         (peVar13 = (peVar13->ev_timeout_pos).ev_next_with_common_timeout.tqe_next,
         peVar13 != (event *)0x0)) {
        if (peVar10 == peVar13) goto LAB_00266e3a;
        peVar13 = (peVar13->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
        if (peVar13 != (event *)0x0) goto code_r0x00266c24;
      }
      goto LAB_00266c35;
    }
    goto LAB_00266c59;
  }
  goto LAB_00266cc8;
code_r0x00266d1f:
  peVar16 = (peVar16->evcb_active_next).tqe_next;
  if (peVar16 == peVar17) {
LAB_00266ef7:
    pcVar14 = "elm1 != elm2";
    goto LAB_00266f23;
  }
  goto LAB_00266d01;
LAB_00266d39:
  peVar17 = (peVar15->evcb_active_next).tqe_next;
  if (peVar17 == (event_callback *)0x0) goto code_r0x00266d41;
  bVar19 = peVar15 != (event_callback *)(peVar17->evcb_active_next).tqe_prev;
  peVar15 = peVar17;
  if (bVar19) {
    pcVar14 = "nextp == elm1->evcb_active_next.tqe_prev";
    goto LAB_00266f23;
  }
  goto LAB_00266d39;
code_r0x00266d41:
  if (peVar15 != (event_callback *)peVar4[uVar18].tqh_last) {
    pcVar14 = "nextp == (&base->activequeues[i])->tqh_last";
LAB_00266f23:
    uVar8 = 0xfa7;
    goto LAB_00266f34;
  }
LAB_00266d70:
  for (; peVar12 != (event_callback *)0x0; peVar12 = (peVar12->evcb_active_next).tqe_next) {
    if ((peVar12->evcb_flags & 0x28U) != 8) {
      pcVar14 = "(evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE";
      uVar8 = 0xfa9;
      goto LAB_00266f34;
    }
    if (uVar18 != peVar12->evcb_pri) {
      pcVar14 = "evcb->evcb_pri == i";
      uVar8 = 0xfaa;
      goto LAB_00266f34;
    }
    iVar6 = iVar6 + 1;
  }
  uVar18 = uVar18 + 1;
  goto LAB_00266cd7;
code_r0x00266c24:
  peVar10 = (peVar10->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
  if (peVar10 == peVar13) {
LAB_00266e3a:
    pcVar14 = "elm1 != elm2";
    goto LAB_00266e66;
  }
  goto LAB_00266c04;
LAB_00266c35:
  peVar10 = (pcVar9->events).tqh_first;
  if (peVar10 == (event *)0x0) goto LAB_00266c4f;
  bVar19 = pcVar9 != (common_timeout_list *)
                     (peVar10->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
  pcVar9 = (common_timeout_list *)&peVar10->ev_timeout_pos;
  if (bVar19) {
    pcVar14 = "nextp == elm1->ev_timeout_pos.ev_next_with_common_timeout.tqe_prev";
    goto LAB_00266e66;
  }
  goto LAB_00266c35;
LAB_00266c4f:
  if (pcVar9 != (common_timeout_list *)(pcVar7->events).tqh_last) {
    pcVar14 = "nextp == (&ctl->events)->tqh_last";
LAB_00266e66:
    uVar8 = 0xf97;
    goto LAB_00266f34;
  }
LAB_00266c59:
  peVar10 = (event *)0x0;
  while (peVar13 = (pcVar7->events).tqh_first, peVar13 != (event *)0x0) {
    if (peVar10 != (event *)0x0) {
      lVar2 = (peVar13->ev_timeout).tv_sec;
      lVar3 = (peVar10->ev_timeout).tv_sec;
      bVar20 = SBORROW8(lVar3,lVar2);
      lVar5 = lVar3 - lVar2;
      bVar19 = lVar3 == lVar2;
      if (bVar19) {
        lVar2 = (peVar10->ev_timeout).tv_usec;
        lVar3 = (peVar13->ev_timeout).tv_usec;
        bVar20 = SBORROW8(lVar2,lVar3);
        lVar5 = lVar2 - lVar3;
        bVar19 = lVar2 == lVar3;
      }
      if (!bVar19 && bVar20 == lVar5 < 0) {
        pcVar14 = "evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=)";
        uVar8 = 0xf9b;
        goto LAB_00266f34;
      }
    }
    if (((peVar13->ev_evcallback).evcb_flags & 1) == 0) {
      pcVar14 = "ev->ev_flags & EVLIST_TIMEOUT";
      uVar8 = 0xf9c;
      goto LAB_00266f34;
    }
    iVar6 = is_common_timeout(&peVar13->ev_timeout,base);
    if (iVar6 == 0) {
      pcVar14 = "is_common_timeout(&ev->ev_timeout,base)";
      uVar8 = 0xf9d;
      goto LAB_00266f34;
    }
    pcVar7 = (common_timeout_list *)&peVar13->ev_timeout_pos;
    peVar10 = peVar13;
    if (((uint)(peVar13->ev_timeout).tv_usec >> 0x14 & 0xff) != uVar18) {
      pcVar14 = "COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i";
      uVar8 = 0xf9e;
      goto LAB_00266f34;
    }
  }
  uVar18 = uVar18 + 1;
  goto LAB_00266be5;
LAB_00266cc8:
  uVar18 = 0;
  uVar11 = (ulong)(uint)base->nactivequeues;
  if (base->nactivequeues < 1) {
    uVar11 = uVar18;
  }
  iVar6 = 0;
LAB_00266cd7:
  if (uVar18 != uVar11) {
    peVar4 = base->activequeues;
    peVar12 = peVar4[uVar18].tqh_first;
    if (peVar12 != (event_callback *)0x0) {
      peVar15 = (event_callback *)(peVar4 + uVar18);
      peVar16 = peVar12;
      peVar17 = peVar12;
LAB_00266d01:
      if ((peVar16 != (event_callback *)0x0) &&
         (peVar17 = (peVar17->evcb_active_next).tqe_next, peVar17 != (event_callback *)0x0)) {
        if (peVar16 == peVar17) goto LAB_00266ef7;
        peVar17 = (peVar17->evcb_active_next).tqe_next;
        if (peVar17 != (event_callback *)0x0) goto code_r0x00266d1f;
      }
      goto LAB_00266d39;
    }
    goto LAB_00266d70;
  }
  peVar12 = (event_callback *)&base->active_later_queue;
  while (peVar12 = (peVar12->evcb_active_next).tqe_next, peVar12 != (event_callback *)0x0) {
    if ((peVar12->evcb_flags & 0x28U) != 0x20) {
      pcVar14 = "(evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER";
      uVar8 = 0xfb2;
      goto LAB_00266f34;
    }
    iVar6 = iVar6 + 1;
  }
  if (base->event_count_active == iVar6) {
    return;
  }
  pcVar14 = "count == base->event_count_active";
  uVar8 = 0xfb6;
LAB_00266f34:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
             ,uVar8,pcVar14,"event_base_assert_ok_nolock_");
}

Assistant:

void
event_base_assert_ok_nolock_(struct event_base *base)
{
	int i;
	int count;

	/* First do checks on the per-fd and per-signal lists */
	evmap_check_integrity_(base);

	/* Check the heap property */
	for (i = 1; i < (int)base->timeheap.n; ++i) {
		int parent = (i - 1) / 2;
		struct event *ev, *p_ev;
		ev = base->timeheap.p[i];
		p_ev = base->timeheap.p[parent];
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
		EVUTIL_ASSERT(evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=));
		EVUTIL_ASSERT(ev->ev_timeout_pos.min_heap_idx == i);
	}

	/* Check that the common timeouts are fine */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl = base->common_timeout_queues[i];
		struct event *last=NULL, *ev;

		EVUTIL_ASSERT_TAILQ_OK(&ctl->events, event, ev_timeout_pos.ev_next_with_common_timeout);

		TAILQ_FOREACH(ev, &ctl->events, ev_timeout_pos.ev_next_with_common_timeout) {
			if (last)
				EVUTIL_ASSERT(evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=));
			EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
			EVUTIL_ASSERT(is_common_timeout(&ev->ev_timeout,base));
			EVUTIL_ASSERT(COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i);
			last = ev;
		}
	}

	/* Check the active queues. */
	count = 0;
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		EVUTIL_ASSERT_TAILQ_OK(&base->activequeues[i], event_callback, evcb_active_next);
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE);
			EVUTIL_ASSERT(evcb->evcb_pri == i);
			++count;
		}
	}

	{
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->active_later_queue, evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER);
			++count;
		}
	}
	EVUTIL_ASSERT(count == base->event_count_active);
}